

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserSamTest_CompressedParseInChunks_Test::
~BioparserSamTest_CompressedParseInChunks_Test(BioparserSamTest_CompressedParseInChunks_Test *this)

{
  BioparserSamTest_CompressedParseInChunks_Test *this_local;
  
  ~BioparserSamTest_CompressedParseInChunks_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserSamTest, CompressedParseInChunks) {
  Setup("sample.sam.gz");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}